

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression_impl.cc
# Opt level: O2

void __thiscall
webrtc::NoiseSuppressionImpl::AnalyzeCaptureAudio(NoiseSuppressionImpl *this,AudioBuffer *audio)

{
  pointer puVar1;
  NsHandle *NS_inst;
  string *psVar2;
  float **ppfVar3;
  ostream *poVar4;
  size_t i;
  ulong channel;
  size_t local_1a8;
  CritScope cs;
  FatalMessage local_198;
  
  if (audio == (AudioBuffer *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
               ,0x47);
    poVar4 = std::operator<<((ostream *)&local_198,"Check failed: audio");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<(poVar4,"# ");
  }
  else {
    rtc::CritScope::CritScope(&cs,this->crit_);
    if (this->enabled_ != true) {
LAB_00184413:
      rtc::CritScope::~CritScope(&cs);
      return;
    }
    local_1a8 = CONCAT44(local_1a8._4_4_,0xa0);
    local_198._0_8_ = AudioBuffer::num_frames_per_band(audio);
    psVar2 = rtc::CheckGEImpl<unsigned_int,unsigned_long>
                       ((uint *)&local_1a8,(unsigned_long *)&local_198,
                        "160u >= audio->num_frames_per_band()");
    if (psVar2 == (string *)0x0) {
      local_198._0_8_ =
           (long)(this->suppressors_).
                 super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->suppressors_).
                 super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
      local_1a8 = AudioBuffer::num_channels(audio);
      psVar2 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                         ((unsigned_long *)&local_198,&local_1a8,
                          "suppressors_.size() == audio->num_channels()");
      if (psVar2 == (string *)0x0) {
        for (channel = 0;
            puVar1 = (this->suppressors_).
                     super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            channel < (ulong)((long)(this->suppressors_).
                                    super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
            channel = channel + 1) {
          NS_inst = *(NsHandle **)
                     puVar1[channel]._M_t.
                     super___uniq_ptr_impl<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                     ._M_t;
          ppfVar3 = AudioBuffer::split_bands_const_f(audio,channel);
          WebRtcNs_Analyze(NS_inst,*ppfVar3);
        }
        goto LAB_00184413;
      }
      rtc::FatalMessage::FatalMessage
                (&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
                 ,0x4f,psVar2);
    }
    else {
      rtc::FatalMessage::FatalMessage
                (&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/noise_suppression_impl.cc"
                 ,0x4e,psVar2);
    }
  }
  rtc::FatalMessage::~FatalMessage(&local_198);
}

Assistant:

void NoiseSuppressionImpl::AnalyzeCaptureAudio(AudioBuffer* audio) {
  RTC_DCHECK(audio);
#if defined(WEBRTC_NS_FLOAT)
  rtc::CritScope cs(crit_);
  if (!enabled_) {
    return;
  }

  RTC_DCHECK_GE(160u, audio->num_frames_per_band());
  RTC_DCHECK_EQ(suppressors_.size(), audio->num_channels());
  for (size_t i = 0; i < suppressors_.size(); i++) {
    WebRtcNs_Analyze(suppressors_[i]->state(),
                     audio->split_bands_const_f(i)[kBand0To8kHz]);
  }
#endif
}